

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slacking.hpp
# Opt level: O0

void __thiscall slack::_detail::CategoryChat::CategoryChat(CategoryChat *this,Slacking *slack)

{
  Slacking *slack_local;
  CategoryChat *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::string((string *)&this->username);
  std::__cxx11::string::string((string *)&this->icon_url);
  std::__cxx11::string::string((string *)&this->icon_emoji);
  std::__cxx11::string::string((string *)&this->parse);
  this->as_user = false;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::basic_json(&this->attachments,(nullptr_t)0x0);
  this->slack_ = slack;
  return;
}

Assistant:

CategoryChat(Slacking& slack) : slack_{slack} {}